

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::ROIAlign_x86_fma::forward
          (ROIAlign_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint _c;
  void *pvVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  float *pfVar11;
  int iVar12;
  int iVar13;
  void *pvVar14;
  int pw;
  long lVar15;
  _func_int *p_Var16;
  int iVar17;
  int iVar18;
  int iVar19;
  Mat *this_00;
  bool bVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_ZMM6 [64];
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  undefined1 auVar39 [16];
  float fVar40;
  undefined1 in_register_000015c4 [12];
  allocator_type local_111;
  _func_int **local_110;
  long local_108;
  ulong local_100;
  pointer local_f8;
  void *local_f0;
  ulong local_e8;
  int local_dc;
  undefined1 local_d8 [16];
  Mat *local_c0;
  _func_int **local_b8;
  ROIAlign_x86_fma *local_b0;
  undefined1 local_a8 [16];
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> pre_calc;
  
  local_f8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
  iVar4 = local_f8->w;
  iVar13 = local_f8->h;
  _c = local_f8->c;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,*(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86_fma[-3]),
              *(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86_fma[-3]),_c,
              local_f8->elemsize,opt->blob_allocator);
  iVar19 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    p_Var16 = this->_vptr_ROIAlign_x86_fma[-3];
    fVar21 = *(float *)(&this->field_0xd8 + (long)p_Var16);
    uVar1 = *local_f8[1].data;
    uVar2 = *(undefined8 *)((long)local_f8[1].data + 8);
    auVar32._0_4_ = fVar21 * (float)uVar1;
    auVar32._4_4_ = fVar21 * (float)((ulong)uVar1 >> 0x20);
    auVar32._8_4_ = fVar21 * 0.0;
    auVar32._12_4_ = fVar21 * 0.0;
    auVar22._0_4_ = (float)uVar2 * fVar21;
    auVar22._4_4_ = (float)((ulong)uVar2 >> 0x20) * fVar21;
    auVar22._8_4_ = fVar21 * 0.0;
    auVar22._12_4_ = fVar21 * 0.0;
    auVar22 = vsubps_avx(auVar22,auVar32);
    if ((&this->field_0xe0)[(long)p_Var16] == '\x01') {
      auVar32._0_4_ = auVar32._0_4_ + -0.5;
      auVar32._4_4_ = auVar32._4_4_ + -0.5;
      auVar32._8_4_ = auVar32._8_4_ + -0.5;
      auVar32._12_4_ = auVar32._12_4_ + -0.5;
    }
    else {
      auVar23._8_4_ = 0x3f800000;
      auVar23._0_8_ = 0x3f8000003f800000;
      auVar23._12_4_ = 0x3f800000;
      auVar22 = vmaxps_avx(auVar22,auVar23);
    }
    uVar5 = *(ulong *)(&this->field_0xd0 + (long)p_Var16);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar5;
    auVar23 = vcvtdq2ps_avx(auVar29);
    auVar29 = vrcpps_avx(auVar23);
    auVar28._0_4_ = auVar22._0_4_ * auVar29._0_4_;
    auVar28._4_4_ = auVar22._4_4_ * auVar29._4_4_;
    auVar28._8_4_ = auVar22._8_4_ * auVar29._8_4_;
    auVar28._12_4_ = auVar22._12_4_ * auVar29._12_4_;
    auVar22 = vfmsub213ps_fma(auVar23,auVar28,auVar22);
    local_a8 = vfnmadd213ps_fma(auVar22,auVar29,auVar28);
    iVar19 = (int)(uVar5 >> 0x20);
    local_100 = (ulong)_c;
    local_c0 = this_00;
    local_b0 = this;
    if (*(int *)(&this->field_0xe4 + (long)p_Var16) == 1) {
      local_d8 = vmovshdup_avx(local_a8);
      local_110 = (_func_int **)CONCAT44(local_110._4_4_,iVar13);
      if (*(int *)(&this->field_0xdc + (long)p_Var16) < 1) {
        auVar22 = vroundss_avx(local_d8,local_d8,10);
        fVar21 = auVar22._0_4_;
        auVar22 = vroundss_avx(local_a8,local_a8,10);
        fVar31 = auVar22._0_4_;
      }
      else {
        fVar21 = (float)*(int *)(&this->field_0xdc + (long)p_Var16);
        fVar31 = fVar21;
      }
      iVar17 = (int)fVar21;
      iVar10 = (int)fVar31;
      iVar13 = 1;
      if (1 < iVar17 * iVar10) {
        iVar13 = iVar17 * iVar10;
      }
      local_108 = CONCAT44(local_108._4_4_,(float)iVar13);
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,(long)iVar19 * (long)(int)uVar5 * (long)iVar17 * (long)iVar10,&local_111)
      ;
      auVar22 = vmovshdup_avx(auVar32);
      detectron2_pre_calc_for_bilinear_interpolate<float>
                ((int)local_110,iVar4,
                 *(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86_fma[-3]),
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86_fma[-3]),iVar17,iVar10,
                 auVar22._0_4_,auVar32._0_4_,(float)local_d8._0_4_,(float)local_a8._0_4_,iVar17,
                 iVar10,&pre_calc);
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      if (iVar17 < 1) {
        iVar17 = 0;
      }
      local_110 = this->_vptr_ROIAlign_x86_fma;
      local_d8._0_4_ = iVar17 * iVar10;
      if ((int)_c < 1) {
        local_100 = 0;
      }
      fVar21 = 1.0 / (float)local_108;
      uVar5 = 0;
      while (uVar7 = uVar5, uVar7 != local_100) {
        lVar8 = local_f8->cstep * uVar7 * local_f8->elemsize;
        pvVar3 = local_f8->data;
        pvVar14 = (void *)(this_00->cstep * uVar7 * this_00->elemsize + (long)this_00->data);
        p_Var16 = local_110[-3];
        iVar13 = 0;
        for (iVar4 = 0; iVar4 < *(int *)(&this->field_0xd4 + (long)p_Var16); iVar4 = iVar4 + 1) {
          local_108 = CONCAT44(local_108._4_4_,iVar4);
          for (lVar15 = 0; lVar15 < *(int *)(&this->field_0xd0 + (long)p_Var16); lVar15 = lVar15 + 1
              ) {
            fVar31 = 0.0;
            iVar19 = iVar13;
            for (iVar18 = 0; iVar18 != iVar17; iVar18 = iVar18 + 1) {
              pfVar11 = &pre_calc.
                         super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar19].w1;
              iVar9 = iVar10;
              while (bVar20 = iVar9 != 0, iVar9 = iVar9 + -1, bVar20) {
                auVar22 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar3 +
                                                         (long)((PreCalc<float> *)(pfVar11 + -4))->
                                                               pos1 * 4 + lVar8)),
                                        ZEXT416(*(uint *)((long)pvVar3 +
                                                         (long)(int)pfVar11[-3] * 4 + lVar8)),0x10);
                auVar22 = vinsertps_avx(auVar22,ZEXT416(*(uint *)((long)pvVar3 +
                                                                 (long)(int)pfVar11[-2] * 4 + lVar8)
                                                       ),0x20);
                auVar22 = vinsertps_avx(auVar22,ZEXT416(*(uint *)((long)pvVar3 +
                                                                 (long)(int)pfVar11[-1] * 4 + lVar8)
                                                       ),0x30);
                auVar27._0_4_ = auVar22._0_4_ * *pfVar11;
                auVar27._4_4_ = auVar22._4_4_ * pfVar11[1];
                auVar27._8_4_ = auVar22._8_4_ * pfVar11[2];
                auVar27._12_4_ = auVar22._12_4_ * pfVar11[3];
                auVar22 = vhaddps_avx(auVar27,auVar27);
                auVar22 = vhaddps_avx(auVar22,auVar22);
                fVar31 = fVar31 + auVar22._0_4_;
                pfVar11 = pfVar11 + 8;
              }
              iVar19 = iVar19 + iVar10;
            }
            iVar13 = iVar13 + iVar17 * iVar10;
            *(float *)((long)pvVar14 + lVar15 * 4) = fVar31 * fVar21;
            p_Var16 = local_110[-3];
            this = local_b0;
          }
          pvVar14 = (void *)((long)pvVar14 + (long)*(int *)(&this->field_0xd0 + (long)p_Var16) * 4);
          this_00 = local_c0;
        }
        local_e8 = uVar7;
        uVar5 = uVar7 + 1;
      }
    }
    else {
      if (*(int *)(&this->field_0xe4 + (long)p_Var16) != 0) {
        return 0;
      }
      auVar25._0_4_ = (float)*(int *)(&this->field_0xdc + (long)p_Var16);
      auVar25._4_12_ = in_ZMM6._4_12_;
      auVar23 = vroundps_avx(local_a8,10);
      auVar22 = vpshufd_avx(ZEXT416((uint)CONCAT71((int7)((ulong)p_Var16 >> 8),
                                                   0 < *(int *)(&this->field_0xdc + (long)p_Var16)))
                            ,0x50);
      auVar29 = vpslld_avx(auVar22,0x1f);
      auVar22 = vmovsldup_avx(auVar25);
      auVar22 = vblendvps_avx(auVar23,auVar22,auVar29);
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,
                 (long)iVar19 * (long)(int)auVar22._4_4_ *
                 (long)(int)uVar5 * (long)(int)auVar22._0_4_,&local_111);
      p_Var16 = this->_vptr_ROIAlign_x86_fma[-3];
      auVar22 = vmovshdup_avx(local_a8);
      auVar23 = vmovshdup_avx(auVar32);
      original_pre_calc_for_bilinear_interpolate<float>
                (iVar13,iVar4,*(int *)(&this->field_0xd4 + (long)p_Var16),
                 *(int *)(&this->field_0xd0 + (long)p_Var16),auVar23._0_4_,auVar32._0_4_,
                 auVar22._0_4_,local_a8._0_4_,*(int *)(&this->field_0xdc + (long)p_Var16),&pre_calc)
      ;
      local_b8 = this->_vptr_ROIAlign_x86_fma;
      auVar24._0_4_ = (float)iVar13;
      auVar24._4_12_ = in_ZMM6._4_12_;
      auVar26._0_4_ = (float)iVar4;
      auVar26._4_12_ = in_ZMM6._4_12_;
      uVar5 = 0;
      if ((int)_c < 1) {
        local_100 = uVar5;
      }
      for (; uVar5 != local_100; uVar5 = uVar5 + 1) {
        lVar8 = local_f8->cstep * uVar5 * local_f8->elemsize;
        pvVar14 = local_f8->data;
        local_f0 = (void *)(this_00->cstep * uVar5 * this_00->elemsize + (long)this_00->data);
        p_Var16 = local_b8[-3];
        iVar13 = 0;
        iVar4 = 0;
        while (iVar4 < *(int *)(&this->field_0xd4 + (long)p_Var16)) {
          auVar30._0_4_ = (float)iVar4;
          auVar30._4_12_ = in_ZMM6._4_12_;
          auVar29 = vfmadd213ss_fma(auVar30,auVar22,auVar23);
          iVar4 = iVar4 + 1;
          auVar33._0_4_ = (float)iVar4;
          auVar33._4_12_ = in_ZMM6._4_12_;
          auVar27 = vfmadd213ss_fma(auVar33,auVar22,auVar23);
          auVar29 = vmaxss_avx(auVar29,ZEXT816(0) << 0x40);
          auVar28 = vminss_avx(auVar24,auVar29);
          auVar29 = vmaxss_avx(auVar27,ZEXT816(0) << 0x40);
          auVar29 = vminss_avx(auVar24,auVar29);
          fVar21 = auVar28._0_4_;
          fVar31 = auVar29._0_4_;
          auVar29 = vroundss_avx(ZEXT416((uint)(fVar31 - fVar21)),ZEXT416((uint)(fVar31 - fVar21)),
                                 10);
          lVar15 = 0;
          while (lVar15 < *(int *)(&this->field_0xd0 + (long)p_Var16)) {
            auVar36._0_4_ = (float)(int)lVar15;
            auVar36._4_12_ = in_register_000015c4;
            auVar28 = vfmadd213ss_fma(auVar36,local_a8,auVar32);
            local_108 = lVar15 + 1;
            auVar39._0_4_ = (float)(int)local_108;
            auVar39._4_12_ = in_register_000015c4;
            auVar25 = vfmadd213ss_fma(auVar39,local_a8,auVar32);
            auVar30 = ZEXT816(0) << 0x40;
            in_ZMM6 = ZEXT1664(auVar30);
            auVar28 = vmaxss_avx(auVar28,auVar30);
            auVar27 = vminss_avx(auVar26,auVar28);
            auVar28 = vmaxss_avx(auVar25,auVar30);
            auVar28 = vminss_avx(auVar28,auVar26);
            local_d8._0_8_ = lVar15;
            fVar34 = auVar27._0_4_;
            fVar38 = auVar28._0_4_;
            if (*(int *)(&this->field_0xdc + (long)p_Var16) < 1) {
              auVar28 = vroundss_avx(ZEXT416((uint)(fVar38 - fVar34)),
                                     ZEXT416((uint)(fVar38 - fVar34)),10);
              fVar40 = auVar29._0_4_;
              fVar35 = auVar28._0_4_;
            }
            else {
              fVar40 = (float)*(int *)(&this->field_0xdc + (long)p_Var16);
              fVar35 = fVar40;
            }
            iVar17 = (int)fVar40;
            iVar18 = (int)fVar35;
            local_e8 = CONCAT71(local_e8._1_7_,fVar31 <= fVar21 || fVar38 <= fVar34);
            iVar10 = 0;
            iVar19 = 0;
            if (0 < iVar18) {
              iVar19 = iVar18;
            }
            iVar9 = 0;
            if (0 < iVar17) {
              iVar9 = iVar17;
            }
            local_110 = (_func_int **)CONCAT44(local_110._4_4_,iVar13);
            iVar12 = iVar13;
            for (; iVar10 != iVar9; iVar10 = iVar10 + 1) {
              pfVar11 = &pre_calc.
                         super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar12].w1;
              iVar6 = iVar19;
              while (bVar20 = iVar6 != 0, iVar6 = iVar6 + -1, bVar20) {
                auVar28 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar14 +
                                                         (long)((PreCalc<float> *)(pfVar11 + -4))->
                                                               pos1 * 4 + lVar8)),
                                        ZEXT416(*(uint *)((long)pvVar14 +
                                                         (long)(int)pfVar11[-3] * 4 + lVar8)),0x10);
                auVar28 = vinsertps_avx(auVar28,ZEXT416(*(uint *)((long)pvVar14 +
                                                                 (long)(int)pfVar11[-2] * 4 + lVar8)
                                                       ),0x20);
                auVar28 = vinsertps_avx(auVar28,ZEXT416(*(uint *)((long)pvVar14 +
                                                                 (long)(int)pfVar11[-1] * 4 + lVar8)
                                                       ),0x30);
                auVar37._0_4_ = auVar28._0_4_ * *pfVar11;
                auVar37._4_4_ = auVar28._4_4_ * pfVar11[1];
                auVar37._8_4_ = auVar28._8_4_ * pfVar11[2];
                auVar37._12_4_ = auVar28._12_4_ * pfVar11[3];
                auVar28 = vhaddps_avx(auVar37,auVar37);
                auVar28 = vhaddps_avx(auVar28,auVar28);
                in_ZMM6 = ZEXT464((uint)(in_ZMM6._0_4_ + auVar28._0_4_));
                pfVar11 = pfVar11 + 8;
              }
              iVar12 = iVar12 + iVar19;
            }
            fVar35 = 0.0;
            if (fVar31 > fVar21 && fVar38 > fVar34) {
              fVar35 = in_ZMM6._0_4_ / (float)(iVar18 * iVar17);
            }
            iVar13 = iVar13 + iVar9 * iVar19;
            *(float *)((long)local_f0 + lVar15 * 4) = fVar35;
            lVar15 = local_108;
            this = local_b0;
            p_Var16 = local_b8[-3];
          }
          local_f0 = (void *)((long)local_f0 + (long)*(int *)(&this->field_0xd0 + (long)p_Var16) * 4
                             );
          local_dc = iVar4;
        }
        this_00 = local_c0;
      }
    }
    std::_Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::~_Vector_base
              (&pre_calc.
                super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>);
    iVar19 = 0;
  }
  return iVar19;
}

Assistant:

int ROIAlign_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const int width = bottom_blob.w;
    const int height = bottom_blob.h;
    const size_t elemsize = bottom_blob.elemsize;
    const int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: max pool over R
    const float* roi_ptr = roi_blob;

    float roi_start_w = roi_ptr[0] * spatial_scale;
    float roi_start_h = roi_ptr[1] * spatial_scale;
    float roi_end_w = roi_ptr[2] * spatial_scale;
    float roi_end_h = roi_ptr[3] * spatial_scale;
    if (aligned)
    {
        roi_start_w -= 0.5f;
        roi_start_h -= 0.5f;
        roi_end_w -= 0.5f;
        roi_end_h -= 0.5f;
    }

    float roi_width = roi_end_w - roi_start_w;
    float roi_height = roi_end_h - roi_start_h;

    if (!aligned)
    {
        roi_width = std::max(roi_width, 1.f);
        roi_height = std::max(roi_height, 1.f);
    }

    float bin_size_w = (float)roi_width / (float)pooled_width;
    float bin_size_h = (float)roi_height / (float)pooled_height;

    if (version == 0)
    {
        // original version
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));
        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        original_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            sampling_ratio,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    // Compute pooling region for this output unit:
                    //  start (included) = ph * roi_height / pooled_height
                    //  end (excluded) = (ph + 1) * roi_height / pooled_height
                    float hstart = roi_start_h + ph * bin_size_h;
                    float wstart = roi_start_w + pw * bin_size_w;
                    float hend = roi_start_h + (ph + 1) * bin_size_h;
                    float wend = roi_start_w + (pw + 1) * bin_size_w;

                    hstart = std::min(std::max(hstart, 0.f), (float)height);
                    wstart = std::min(std::max(wstart, 0.f), (float)width);
                    hend = std::min(std::max(hend, 0.f), (float)height);
                    wend = std::min(std::max(wend, 0.f), (float)width);

                    int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
                    int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

                    bool is_empty = (hend <= hstart) || (wend <= wstart);
                    int area = bin_grid_h * bin_grid_w;

                    float sum = 0.f;
                    for (int by = 0; by < bin_grid_h; by++)
                    {
                        for (int bx = 0; bx < bin_grid_w; bx++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];
                            // bilinear interpolate at (x,y)
                            sum += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    outptr[pw] = is_empty ? 0.f : (sum / (float)area);
                }

                outptr += pooled_width;
            }
        }
    }
    else if (version == 1)
    {
        // the version in detectron 2
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));

        const float count = (float)std::max(roi_bin_grid_h * roi_bin_grid_w, 1);

        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        detectron2_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_bin_grid_h,
            roi_bin_grid_w,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            roi_bin_grid_h,
            roi_bin_grid_w,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    float output_val = 0.f;
                    for (int iy = 0; iy < roi_bin_grid_h; iy++)
                    {
                        for (int ix = 0; ix < roi_bin_grid_w; ix++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];

                            output_val += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    output_val /= count;
                    outptr[pw] = output_val;
                }
                outptr += pooled_width;
            }
        }
    }

    return 0;
}